

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-expr.c
# Opt level: O0

void coda_expression_delete(coda_expression *expr)

{
  long lVar1;
  long lVar2;
  int local_1c;
  int i;
  coda_expression_operation *opexpr;
  coda_expression *expr_local;
  
  if (2 < expr->tag - expr_constant_boolean) {
    if (expr->tag - expr_constant_rawstring < 2) {
      lVar1._0_4_ = expr[1].is_constant;
      lVar1._4_4_ = expr[1].recursion_depth;
      if (lVar1 != 0) {
        free(*(void **)&expr[1].is_constant);
      }
    }
    else {
      lVar2._0_4_ = expr[1].tag;
      lVar2._4_4_ = expr[1].result_type;
      if (lVar2 != 0) {
        free(*(void **)(expr + 1));
      }
      for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
        if (*(long *)(&expr[1].is_constant + (long)local_1c * 2) != 0) {
          coda_expression_delete(*(coda_expression **)(&expr[1].is_constant + (long)local_1c * 2));
        }
      }
    }
  }
  free(expr);
  return;
}

Assistant:

LIBCODA_API void coda_expression_delete(coda_expression *expr)
{
    switch (expr->tag)
    {
        case expr_constant_boolean:
        case expr_constant_float:
        case expr_constant_integer:
            break;
        case expr_constant_rawstring:
        case expr_constant_string:
            if (((coda_expression_string_constant *)expr)->value != NULL)
            {
                free(((coda_expression_string_constant *)expr)->value);
            }
            break;
        default:
            {
                coda_expression_operation *opexpr;
                int i;

                opexpr = (coda_expression_operation *)expr;
                if (opexpr->identifier != NULL)
                {
                    free(opexpr->identifier);
                }
                for (i = 0; i < 4; i++)
                {
                    if (opexpr->operand[i] != NULL)
                    {
                        coda_expression_delete(opexpr->operand[i]);
                    }
                }
            }
            break;
    }
    free(expr);
}